

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithInit(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int v;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(ulong *)pObj;
    uVar5 = *(ulong *)pObj & 0x1fffffff;
    if (uVar5 == 0x1fffffff || (int)uVar1 < 0) {
      if ((~uVar1 & 0x9fffffff) == 0) {
        uVar1 = Gia_ManAppendCi(p_00);
        pObj->Value = uVar1;
        uVar1 = Abc_LitNotCond(uVar1,*(uint *)pObj >> 0x1e & 1);
        goto LAB_0048c65a;
      }
      if ((int)uVar1 < 0 && (int)uVar5 != 0x1fffffff) {
        uVar1 = Gia_ObjFanin0Copy(pObj);
        pObj->Value = uVar1;
        uVar1 = Abc_LitNotCond(uVar1,*(uint *)pObj >> 0x1e & 1);
        pObj->Value = uVar1;
        uVar1 = Gia_ManAppendCo(p_00,uVar1);
        goto LAB_0048c65a;
      }
    }
    else {
      uVar1 = Gia_ObjFanin0Copy(pObj);
      uVar2 = Gia_ObjFanin1Copy(pObj);
      pObj_00 = Gia_ManAppendObj(p_00);
      uVar10 = uVar1 >> 1;
      if (p_00->nObjs <= (int)uVar10) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar7 = uVar2 >> 1;
      if ((uint)p_00->nObjs <= uVar7) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if ((uVar10 == uVar7) && (p_00->fGiaSimple == 0)) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      iVar3 = Gia_ObjId(p_00,pObj_00);
      uVar5 = (ulong)(iVar3 - uVar10 & 0x1fffffff);
      if (uVar1 < uVar2) {
        *(ulong *)pObj_00 =
             (ulong)((uVar1 & 1) << 0x1d) | *(ulong *)pObj_00 & 0xffffffffc0000000 | uVar5;
        iVar3 = Gia_ObjId(p_00,pObj_00);
        uVar5 = (ulong)(uVar2 & 1) << 0x3d | (ulong)(iVar3 - uVar7 & 0x1fffffff) << 0x20 |
                *(ulong *)pObj_00 & 0xc0000000ffffffff;
      }
      else {
        *(ulong *)pObj_00 =
             (ulong)(uVar1 & 1) << 0x3d | uVar5 << 0x20 | *(ulong *)pObj_00 & 0xc0000000ffffffff;
        iVar3 = Gia_ObjId(p_00,pObj_00);
        uVar5 = (ulong)((uVar2 & 1) << 0x1d) | *(ulong *)pObj_00 & 0xffffffffc0000000 |
                (ulong)(iVar3 - uVar7 & 0x1fffffff);
      }
      *(ulong *)pObj_00 = uVar5;
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pObj_00 + -(uVar5 & 0x1fffffff),pObj_00);
        Gia_ObjAddFanout(p_00,pObj_00 + -((ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff),pObj_00)
        ;
      }
      if (p_00->fSweeper != 0) {
        uVar6 = *(ulong *)pObj_00 & 0x1fffffff;
        uVar5 = *(ulong *)pObj_00 >> 0x20 & 0x1fffffff;
        uVar8 = 0x4000000000000000;
        if (((uint)*(ulong *)(pObj_00 + -uVar6) >> 0x1e & 1) == 0) {
          uVar8 = 0x40000000;
        }
        *(ulong *)(pObj_00 + -uVar6) = uVar8 | *(ulong *)(pObj_00 + -uVar6);
        uVar8 = *(ulong *)(pObj_00 + -uVar5);
        uVar9 = 0x4000000000000000;
        if (((uint)uVar8 >> 0x1e & 1) == 0) {
          uVar9 = 0x40000000;
        }
        *(ulong *)(pObj_00 + -uVar5) = uVar9 | uVar8;
        uVar5 = *(ulong *)pObj_00;
        *(ulong *)pObj_00 =
             uVar5 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar5 >> 0x3d) ^ (uint)(uVar8 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pObj_00 + -uVar6) >> 0x3f) ^
                    (uint)(uVar5 >> 0x1d) & 7)) << 0x3f;
      }
      if (p_00->fBuiltInSim != 0) {
        uVar5 = *(ulong *)pObj_00;
        *(ulong *)pObj_00 =
             uVar5 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar5 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar5 >> 0x20 & 0x1fffffff)) >> 0x3f)
                     ) & ((uint)((ulong)*(undefined8 *)(pObj_00 + -(uVar5 & 0x1fffffff)) >> 0x3f) ^
                         (uint)(uVar5 >> 0x1d) & 7)) << 0x3f;
        iVar3 = Gia_ObjId(p_00,pObj_00);
        Gia_ManBuiltInSimPerform(p_00,iVar3);
      }
      if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(p_00,pObj_00);
      }
      iVar3 = Gia_ObjId(p_00,pObj_00);
      uVar1 = iVar3 * 2;
LAB_0048c65a:
      pObj->Value = uVar1;
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}